

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  string *psVar1;
  int v1;
  int v2;
  LogMessage *pLVar2;
  unsigned_long t;
  undefined1 auVar3 [16];
  LogMessageFatal local_b0 [23];
  Voidify local_99;
  unsigned_long local_98;
  unsigned_long local_90;
  string *local_88;
  string *absl_log_internal_check_op_result_1;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  LogMessageFatal local_68 [19];
  Voidify local_55 [13];
  undefined1 local_48 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  StringOutputStream *pSStack_10;
  int count_local;
  StringOutputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pSStack_10 = this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue(count);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(v1,v2,"count >= 0");
  if (local_20 != (string *)0x0) {
    local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x96,local_48._0_8_,local_48._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  absl_log_internal_check_op_result_1._7_1_ = 0;
  if (this->target_ == (string *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,"target_ != nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x97,local_78._M_len,local_78._M_str);
    absl_log_internal_check_op_result_1._7_1_ = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_68);
    absl::lts_20240722::log_internal::Voidify::operator&&(local_55,pLVar2);
  }
  if ((absl_log_internal_check_op_result_1._7_1_ & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
  }
  local_90 = absl::lts_20240722::log_internal::GetReferenceableValue
                       ((long)absl_log_internal_check_op_result._4_4_);
  t = std::__cxx11::string::size();
  local_98 = absl::lts_20240722::log_internal::GetReferenceableValue(t);
  local_88 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_90,&local_98,"static_cast<size_t>(count) <= target_->size()");
  if (local_88 == (string *)0x0) {
    psVar1 = this->target_;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)psVar1);
    return;
  }
  auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x98,auVar3._0_8_,auVar3._8_8_);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_b0);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_99,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b0);
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}